

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O1

ProString * __thiscall
ProStringRwUser::extract(ProString *__return_storage_ptr__,ProStringRwUser *this,QString *s)

{
  Data *pDVar1;
  ProString *other;
  long in_FS_OFFSET;
  bool bVar2;
  ProString local_58;
  long local_28;
  
  other = &local_58;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (s->d).d;
  bVar2 = pDVar1 != (((this->super_ProStringRoUser).m_rs)->d).d;
  if (bVar2 || pDVar1 == (Data *)0x0) {
    ProString::ProString(&local_58,s);
    local_58.m_file = this->m_ps->m_file;
  }
  else {
    other = this->m_ps;
  }
  ProString::ProString(__return_storage_ptr__,other);
  if ((bVar2 || pDVar1 == (Data *)0x0) &&
     (&(local_58.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)) {
    LOCK();
    ((local_58.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_58.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_58.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProString extract(const QString &s) const
        { return s.isSharedWith(*m_rs) ? *m_ps : ProString(s).setSource(*m_ps); }